

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

btCollisionShape * __thiscall
btCollisionWorldImporter::convertCollisionShape
          (btCollisionWorldImporter *this,btCollisionShapeData *shapeData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  btOptimizedBvh **ppbVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined8 uVar15;
  int iVar16;
  uint uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar18;
  btOptimizedBvh *pbVar19;
  undefined4 extraout_var_06;
  btCollisionShape *pbVar20;
  btCollisionShape **__s;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  btVector3 *pbVar21;
  _func_int **pp_Var22;
  char *pcVar23;
  btStaticPlaneShapeData *planeData;
  long lVar24;
  undefined1 *puVar25;
  btAlignedObjectArray<btCollisionShape_*> *pbVar26;
  long lVar27;
  char *pcVar28;
  int i_1;
  long lVar29;
  long lVar30;
  int i;
  long lVar31;
  btCapsuleShape *cap;
  btConvexHullShape *pbVar32;
  float fVar34;
  undefined1 auVar33 [16];
  float fVar35;
  btAlignedObjectArray<btVector3> tmpPoints;
  btAlignedObjectArray<float> radii;
  undefined1 local_98 [16];
  btVector3 *local_88;
  bool local_80;
  undefined4 auStack_68 [4];
  btAlignedObjectArray<btCollisionShape_*> local_58;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  
  pbVar26 = (btAlignedObjectArray<btCollisionShape_*> *)local_98;
  uVar17 = shapeData->m_shapeType;
  pbVar32 = (btConvexHullShape *)0x0;
  if (0x1b < (int)uVar17) {
    if (uVar17 == 0x1f) {
      iVar16 = (*this->_vptr_btCollisionWorldImporter[0x15])(this);
      local_58.m_ownsMemory = true;
      local_58.m_data = (btCollisionShape **)0x0;
      local_58.m_size = 0;
      local_58.m_capacity = 0;
      if (0 < shapeData[1].m_shapeType) {
        lVar31 = 0;
        lVar24 = 0;
        do {
          pbVar20 = convertCollisionShape
                              (this,*(btCollisionShapeData **)
                                     (shapeData[1].m_name + lVar24 * 0x50 + 0x40));
          if (pbVar20 != (btCollisionShape *)0x0) {
            pcVar28 = shapeData[1].m_name;
            pcVar23 = pcVar28 + lVar31;
            lVar27 = 0;
            puVar25 = local_98;
            do {
              lVar29 = 0;
              do {
                *(undefined4 *)(puVar25 + lVar29 * 4) = *(undefined4 *)(pcVar23 + lVar29 * 4);
                lVar29 = lVar29 + 1;
              } while (lVar29 != 4);
              lVar27 = lVar27 + 1;
              puVar25 = puVar25 + 0x10;
              pcVar23 = pcVar23 + 0x10;
            } while (lVar27 != 3);
            lVar27 = 0xc;
            do {
              *(undefined4 *)(local_98 + lVar27 * 4) =
                   *(undefined4 *)(pcVar28 + lVar27 * 4 + lVar31);
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x10);
            btCompoundShape::addChildShape
                      ((btCompoundShape *)CONCAT44(extraout_var_06,iVar16),(btTransform *)local_98,
                       pbVar20);
          }
          lVar24 = lVar24 + 1;
          lVar31 = lVar31 + 0x50;
        } while (lVar24 < shapeData[1].m_shapeType);
      }
      btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&local_58);
      return (btCollisionShape *)(btConvexHullShape *)CONCAT44(extraout_var_06,iVar16);
    }
    if (uVar17 != 0x1c) {
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
    local_98 = *(undefined1 (*) [16])(shapeData + 2);
    uVar7 = shapeData[1].m_shapeType;
    uVar8 = shapeData[1].m_padding[0];
    uVar10 = shapeData[1].m_padding[1];
    uVar12 = shapeData[1].m_padding[2];
    uVar14 = shapeData[1].m_padding[3];
    uVar13 = CONCAT11(uVar14,uVar12);
    uVar11 = CONCAT21(uVar13,uVar10);
    uVar9 = CONCAT31(uVar11,uVar8);
    pbVar26 = &local_58;
    local_58._0_4_ = SUB84(shapeData[1].m_name,0);
    local_58.m_size = (int)((ulong)shapeData[1].m_name >> 0x20);
    local_58.m_capacity = uVar7;
    local_58._12_4_ = uVar9;
    iVar16 = (*this->_vptr_btCollisionWorldImporter[4])(*(undefined4 *)&shapeData[3].m_name,this);
    pbVar32 = (btConvexHullShape *)CONCAT44(extraout_var_00,iVar16);
    pp_Var22 = (pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
               super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
               _vptr_btCollisionShape;
    goto LAB_001473cf;
  }
  switch(uVar17) {
  case 4:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
    goto switchD_00146c07_caseD_4;
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    goto switchD_00146c07_caseD_5;
  case 10:
    if ((ulong)(uint)shapeData[3].m_shapeType < 3) {
      iVar16 = (*this->_vptr_btCollisionWorldImporter[(ulong)(uint)shapeData[3].m_shapeType + 7])
                         (0x3f800000,0x3f800000,this);
      pbVar32 = (btConvexHullShape *)CONCAT44(extraout_var_01,iVar16);
      if (pbVar32 != (btConvexHullShape *)0x0) {
        lVar24 = 8;
        do {
          *(undefined4 *)
           ((long)(&(pbVar32->super_btPolyhedralConvexAabbCachingShape).
                    super_btPolyhedralConvexShape.super_btConvexInternalShape.
                    m_implicitShapeDimensions + -2) + lVar24 * 4) =
               *(undefined4 *)(shapeData->m_padding + lVar24 * 4 + -0xc);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0xc);
        (pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.m_collisionMargin = *(btScalar *)&shapeData[3].m_name;
        lVar24 = 4;
        do {
          *(undefined4 *)
           ((long)(&(pbVar32->super_btPolyhedralConvexAabbCachingShape).
                    super_btPolyhedralConvexShape.super_btConvexInternalShape.
                    m_implicitShapeDimensions + -2) + lVar24 * 4) =
               *(undefined4 *)(shapeData->m_padding + lVar24 * 4 + -0xc);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 8);
        *(int *)&(pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                 super_btConvexInternalShape.field_0x44 = shapeData[3].m_shapeType;
        return (btCollisionShape *)pbVar32;
      }
      goto LAB_001473d4;
    }
    pcVar23 = "error: wrong up axis for btCapsuleShape";
    goto LAB_0014718c;
  case 0x15:
    iVar16 = (*this->_vptr_btCollisionWorldImporter[0x13])(this,shapeData + 1);
    iVar16 = (*this->_vptr_btCollisionWorldImporter[0x18])(this,CONCAT44(extraout_var_03,iVar16));
    plVar18 = (long *)CONCAT44(extraout_var_04,iVar16);
    iVar16 = (**(code **)(*plVar18 + 0x38))(plVar18);
    if (iVar16 != 0) {
      pcVar23 = shapeData[2].m_name;
      plVar18[1] = *(long *)&shapeData[1].m_shapeType;
      plVar18[2] = (long)pcVar23;
      if (shapeData[3].m_name == (char *)0x0) {
        pbVar19 = (btOptimizedBvh *)0x0;
      }
      else {
        local_98._0_8_ = shapeData[3].m_name;
        iVar16 = btHashMap<btHashPtr,_btOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(btHashPtr *)local_98);
        ppbVar5 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppbVar5 == (btOptimizedBvh **)0x0 || iVar16 == -1) ||
           (pbVar19 = ppbVar5[iVar16], pbVar19 == (btOptimizedBvh *)0x0)) {
          iVar16 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
          pbVar19 = (btOptimizedBvh *)CONCAT44(extraout_var_05,iVar16);
          (*(pbVar19->super_btQuantizedBvh)._vptr_btQuantizedBvh[5])(pbVar19,shapeData[3].m_name);
        }
      }
      lVar24._0_4_ = shapeData[3].m_shapeType;
      lVar24._4_1_ = shapeData[3].m_padding[0];
      lVar24._5_1_ = shapeData[3].m_padding[1];
      lVar24._6_1_ = shapeData[3].m_padding[2];
      lVar24._7_1_ = shapeData[3].m_padding[3];
      if (lVar24 != 0) {
        local_98._0_8_ = lVar24;
        iVar16 = btHashMap<btHashPtr,_btOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(btHashPtr *)local_98);
        ppbVar5 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppbVar5 == (btOptimizedBvh **)0x0 || iVar16 == -1) ||
           (pbVar19 = ppbVar5[iVar16], pbVar19 == (btOptimizedBvh *)0x0)) {
          iVar16 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
          pbVar19 = (btOptimizedBvh *)CONCAT44(extraout_var_07,iVar16);
          uVar15._0_4_ = shapeData[3].m_shapeType;
          uVar15._4_1_ = shapeData[3].m_padding[0];
          uVar15._5_1_ = shapeData[3].m_padding[1];
          uVar15._6_1_ = shapeData[3].m_padding[2];
          uVar15._7_1_ = shapeData[3].m_padding[3];
          (*(pbVar19->super_btQuantizedBvh)._vptr_btQuantizedBvh[6])(pbVar19,uVar15);
        }
      }
      iVar16 = (*this->_vptr_btCollisionWorldImporter[0x11])(this,plVar18,pbVar19);
      pbVar32 = (btConvexHullShape *)CONCAT44(extraout_var_08,iVar16);
      (*(pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])(shapeData[4].m_shapeType,pbVar32);
      if (shapeData[4].m_name == (char *)0x0) {
        return (btCollisionShape *)pbVar32;
      }
      iVar16 = (*this->_vptr_btCollisionWorldImporter[0x1a])(this);
      btTriangleInfoMap::deSerialize
                ((btTriangleInfoMap *)CONCAT44(extraout_var_09,iVar16),
                 (btTriangleInfoMapData *)shapeData[4].m_name);
      *(btTriangleInfoMap **)
       (pbVar32->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
           (btTriangleInfoMap *)CONCAT44(extraout_var_09,iVar16);
      return (btCollisionShape *)pbVar32;
    }
    goto LAB_001473d4;
  case 0x16:
    shapeData->m_shapeType = 0x15;
    pbVar20 = convertCollisionShape(this,shapeData);
    local_98 = *(undefined1 (*) [16])(shapeData + 5);
    iVar16 = (*this->_vptr_btCollisionWorldImporter[0x16])(this,pbVar20);
    pbVar32 = (btConvexHullShape *)CONCAT44(extraout_var_02,iVar16);
    goto switchD_00146c07_caseD_5;
  }
  if (uVar17 != 0) {
    return (btCollisionShape *)(btConvexHullShape *)0x0;
  }
switchD_00146c07_caseD_4:
  if (0xd < uVar17) {
switchD_00146c31_caseD_1:
    printf("error: cannot create shape type (%d)\n");
    return (btCollisionShape *)(btConvexHullShape *)0x0;
  }
  pcVar23 = shapeData[2].m_name;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = pcVar23;
  fVar3 = (float)shapeData[2].m_shapeType;
  fVar4 = *(float *)&shapeData[3].m_name;
  fVar35 = SUB84(pcVar23,0);
  fVar34 = (float)((ulong)pcVar23 >> 0x20);
  switch(uVar17) {
  case 0:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = shapeData[1].m_name;
    auVar33 = divps(auVar33,auVar6);
    local_98._4_4_ = fVar4 + auVar33._4_4_;
    local_98._0_4_ = fVar4 + auVar33._0_4_;
    local_98._8_4_ = fVar3 / (float)shapeData[1].m_shapeType + fVar4;
    local_98._12_4_ = 0.0;
    iVar16 = (*this->_vptr_btCollisionWorldImporter[5])(this);
    pbVar32 = (btConvexHullShape *)CONCAT44(extraout_var,iVar16);
    break;
  default:
    goto switchD_00146c31_caseD_1;
  case 4:
    iVar16 = shapeData[4].m_shapeType;
    lVar24 = (long)iVar16;
    local_80 = true;
    local_88 = (btVector3 *)0x0;
    local_98._4_8_ = 0;
    if (lVar24 < 1) {
      local_98._4_4_ = iVar16;
    }
    else {
      pbVar21 = (btVector3 *)btAlignedAllocInternal(lVar24 << 4,0x10);
      if ((long)(int)local_98._4_4_ < 1) {
        if (local_88 != (btVector3 *)0x0) goto LAB_0014719b;
      }
      else {
        lVar31 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_88->m_floats + lVar31);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar21->m_floats + lVar31);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          lVar31 = lVar31 + 0x10;
        } while ((long)(int)local_98._4_4_ * 0x10 != lVar31);
LAB_0014719b:
        if (local_80 == true) {
          btAlignedFreeInternal(local_88);
        }
      }
      auVar33 = local_98;
      local_98._8_4_ = iVar16;
      local_98._0_4_ = auVar33._0_4_;
      local_98._4_4_ = iVar16;
      local_88 = pbVar21;
      if (0 < iVar16) {
        lVar31._0_4_ = shapeData[3].m_shapeType;
        lVar31._4_1_ = shapeData[3].m_padding[0];
        lVar31._5_1_ = shapeData[3].m_padding[1];
        lVar31._6_1_ = shapeData[3].m_padding[2];
        lVar31._7_1_ = shapeData[3].m_padding[3];
        pcVar23 = shapeData[4].m_name;
        lVar29 = 0;
        pcVar28 = pcVar23;
        lVar27 = lVar31;
        do {
          if (lVar31 != 0) {
            lVar30 = 0;
            do {
              pbVar21->m_floats[lVar30] = *(btScalar *)(lVar27 + lVar30 * 4);
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
          }
          if (pcVar23 != (char *)0x0) {
            lVar30 = 0;
            do {
              *(ulong *)(pbVar21->m_floats + lVar30) =
                   CONCAT44((float)*(double *)((long)(pcVar28 + lVar30 * 8) + 8),
                            (float)*(double *)(pcVar28 + lVar30 * 8));
              lVar30 = lVar30 + 2;
            } while (lVar30 != 4);
          }
          lVar29 = lVar29 + 1;
          pbVar21 = pbVar21 + 1;
          lVar27 = lVar27 + 0x10;
          pcVar28 = pcVar28 + 0x20;
        } while (lVar29 != lVar24);
      }
    }
    local_80 = true;
    pbVar32 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[0x14])(this);
    if (0 < iVar16) {
      lVar31 = 0;
      do {
        btConvexHullShape::addPoint(pbVar32,(btVector3 *)((long)local_88->m_floats + lVar31),true);
        lVar31 = lVar31 + 0x10;
      } while (lVar24 * 0x10 != lVar31);
    }
    (*(pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
      super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
      [0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar32);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray
              ((btAlignedObjectArray<btVector3> *)local_98);
    goto LAB_001473ac;
  case 8:
    pbVar32 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[6])(fVar35,this);
    break;
  case 9:
    iVar16 = *(int *)&shapeData[4].m_name;
    lVar24 = (long)iVar16;
    __s = (btCollisionShape **)0x0;
    local_80 = true;
    local_88 = (btVector3 *)0x0;
    local_98._4_8_ = 0;
    local_58.m_ownsMemory = true;
    local_58.m_data = (btCollisionShape **)0x0;
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    uVar17 = 0;
    if (0 < lVar24) {
      __s = (btCollisionShape **)btAlignedAllocInternal(lVar24 * 4,0x10);
      if ((long)local_58.m_size < 1) {
        if (local_58.m_data != (btCollisionShape **)0x0) goto LAB_00147281;
      }
      else {
        lVar31 = 0;
        do {
          *(undefined4 *)((long)__s + lVar31 * 4) =
               *(undefined4 *)((long)local_58.m_data + lVar31 * 4);
          lVar31 = lVar31 + 1;
        } while (local_58.m_size != lVar31);
LAB_00147281:
        if (local_58.m_ownsMemory == true) {
          btAlignedFreeInternal(local_58.m_data);
        }
      }
      local_58.m_ownsMemory = true;
      local_58.m_capacity = iVar16;
      local_58.m_data = __s;
      memset(__s,0,lVar24 * 4);
      uVar17 = local_98._4_4_;
    }
    local_58.m_size = iVar16;
    if (((int)uVar17 < iVar16) && (__s = local_58.m_data, (int)local_98._8_4_ < iVar16)) {
      if (iVar16 == 0) {
        pbVar21 = (btVector3 *)0x0;
      }
      else {
        pbVar21 = (btVector3 *)btAlignedAllocInternal(lVar24 << 4,0x10);
        uVar17 = local_98._4_4_;
      }
      if ((int)uVar17 < 1) {
        if (local_88 != (btVector3 *)0x0) goto LAB_0014730c;
      }
      else {
        lVar31 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_88->m_floats + lVar31);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar21->m_floats + lVar31);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          lVar31 = lVar31 + 0x10;
        } while ((ulong)uVar17 << 4 != lVar31);
LAB_0014730c:
        if (local_80 == true) {
          btAlignedFreeInternal(local_88);
        }
      }
      local_80 = true;
      local_98._8_4_ = iVar16;
      __s = local_58.m_data;
      local_88 = pbVar21;
    }
    local_98._4_4_ = iVar16;
    if (0 < iVar16) {
      lVar31 = *(long *)&shapeData[3].m_shapeType;
      lVar29 = 0;
      lVar27 = lVar31;
      pbVar21 = local_88;
      do {
        lVar30 = 0;
        do {
          pbVar21->m_floats[lVar30] = *(btScalar *)(lVar27 + lVar30 * 4);
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        *(undefined4 *)((long)__s + lVar29 * 4) = *(undefined4 *)(lVar31 + 0x10 + lVar29 * 0x14);
        lVar29 = lVar29 + 1;
        pbVar21 = pbVar21 + 1;
        lVar27 = lVar27 + 0x14;
      } while (lVar29 != lVar24);
    }
    pbVar32 = (btConvexHullShape *)
              (*this->_vptr_btCollisionWorldImporter[0x17])(this,local_88,__s,iVar16);
    btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)&local_58);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray
              ((btAlignedObjectArray<btVector3> *)local_98);
    break;
  case 0xb:
    iVar16 = shapeData[3].m_shapeType;
    if (iVar16 == 2) {
      pbVar32 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[0xf])(fVar35,fVar3,this)
      ;
      break;
    }
    if (iVar16 == 1) {
      pbVar32 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[0xe])(fVar35,fVar34,this);
      break;
    }
    if (iVar16 == 0) {
      pbVar32 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[0xd])(fVar34,fVar35,this);
      break;
    }
    pcVar23 = "unknown Cone up axis";
LAB_0014718c:
    puts(pcVar23);
    goto LAB_001473d4;
  case 0xd:
    fVar35 = fVar4 + fVar35;
    iVar16 = shapeData[3].m_shapeType;
    if (iVar16 == 2) {
      pbVar32 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[0xc])(fVar35,fVar4 + fVar3,this);
    }
    else if (iVar16 == 1) {
      pbVar32 = (btConvexHullShape *)(*this->_vptr_btCollisionWorldImporter[0xb])(fVar35,this);
    }
    else {
      if (iVar16 != 0) {
        pcVar23 = "unknown Cylinder up axis";
        goto LAB_0014718c;
      }
      pbVar32 = (btConvexHullShape *)
                (*this->_vptr_btCollisionWorldImporter[10])(fVar4 + fVar34,fVar35,this);
    }
  }
  if (pbVar32 == (btConvexHullShape *)0x0) {
LAB_001473d4:
    pbVar32 = (btConvexHullShape *)0x0;
  }
  else {
LAB_001473ac:
    (*(pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
      super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
      [0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar32);
    local_98 = *(undefined1 (*) [16])(shapeData + 1);
    pp_Var22 = (pbVar32->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
               super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
               _vptr_btCollisionShape;
LAB_001473cf:
    (*pp_Var22[6])(pbVar32,pbVar26);
  }
switchD_00146c07_caseD_5:
  return (btCollisionShape *)pbVar32;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::convertCollisionShape(  btCollisionShapeData* shapeData  )
{
	btCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
		{
	case STATIC_PLANE_PROXYTYPE:
		{
			btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*)shapeData;
			btVector3 planeNormal,localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal,planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
	case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btScaledTriangleMeshShapeData* scaledMesh = (btScaledTriangleMeshShapeData*) shapeData;
			btCollisionShapeData* colShapeData = (btCollisionShapeData*) &scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			btCollisionShape* childShape = convertCollisionShape(colShapeData);
			btBvhTriangleMeshShape* meshShape = (btBvhTriangleMeshShape*)childShape;
			btVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
	case GIMPACT_SHAPE_PROXYTYPE:
		{
			btGImpactMeshShapeData* gimpactData = (btGImpactMeshShapeData*) shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);


				btGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				btVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(btScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			} else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif //SUPPORT_GIMPACT_SHAPE_IMPORT
	//The btCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API
	//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			btCapsuleShapeData* capData = (btCapsuleShapeData*)shapeData;


			switch (capData->m_upAxis)
			{
			case 0:
				{
					shape = createCapsuleShapeX(1,1);
					break;
				}
			case 1:
				{
					shape = createCapsuleShapeY(1,1);
					break;
				}
			case 2:
				{
					shape = createCapsuleShapeZ(1,1);
					break;
				}
			default:
				{
					printf("error: wrong up axis for btCapsuleShape\n");
				}


			};
			if (shape)
			{
				btCapsuleShape* cap = (btCapsuleShape*) shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
			{
				btConvexInternalShapeData* bsd = (btConvexInternalShapeData*)shapeData;
				btVector3 implicitShapeDimensions;
				implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
				btVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				btVector3 margin(bsd->m_collisionMargin,bsd->m_collisionMargin,bsd->m_collisionMargin);
				switch (shapeData->m_shapeType)
				{
					case BOX_SHAPE_PROXYTYPE:
						{
							btBoxShape* box= (btBoxShape*)createBoxShape(implicitShapeDimensions/localScaling+margin);
							//box->initializePolyhedralFeatures();
							shape = box;

							break;
						}
					case SPHERE_SHAPE_PROXYTYPE:
						{
							shape = createSphereShape(implicitShapeDimensions.getX());
							break;
						}

					case CYLINDER_SHAPE_PROXYTYPE:
						{
							btCylinderShapeData* cylData = (btCylinderShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions+margin;
							switch (cylData->m_upAxis)
							{
							case 0:
								{
									shape = createCylinderShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createCylinderShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createCylinderShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cylinder up axis\n");
								}

							};



							break;
						}
					case CONE_SHAPE_PROXYTYPE:
						{
							btConeShapeData* conData = (btConeShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions;//+margin;
							switch (conData->m_upIndex)
							{
							case 0:
								{
									shape = createConeShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createConeShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createConeShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cone up axis\n");
								}

							};



							break;
						}
					case MULTI_SPHERE_SHAPE_PROXYTYPE:
						{
							btMultiSphereShapeData* mss = (btMultiSphereShapeData*)bsd;
							int numSpheres = mss->m_localPositionArraySize;

							btAlignedObjectArray<btVector3> tmpPos;
							btAlignedObjectArray<btScalar> radii;
							radii.resize(numSpheres);
							tmpPos.resize(numSpheres);
							int i;
							for ( i=0;i<numSpheres;i++)
							{
								tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
								radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
							}
							shape = createMultiSphereShape(&tmpPos[0],&radii[0],numSpheres);
							break;
						}
					case CONVEX_HULL_SHAPE_PROXYTYPE:
						{
						//	int sz = sizeof(btConvexHullShapeData);
						//	int sz2 = sizeof(btConvexInternalShapeData);
						//	int sz3 = sizeof(btCollisionShapeData);
							btConvexHullShapeData* convexData = (btConvexHullShapeData*)bsd;
							int numPoints = convexData->m_numUnscaledPoints;

							btAlignedObjectArray<btVector3> tmpPoints;
							tmpPoints.resize(numPoints);
							int i;
							for ( i=0;i<numPoints;i++)
							{
#ifdef BT_USE_DOUBLE_PRECISION
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif //BT_USE_DOUBLE_PRECISION
							}
							btConvexHullShape* hullShape = createConvexHullShape();
							for (i=0;i<numPoints;i++)
							{
								hullShape->addPoint(tmpPoints[i]);
							}
							hullShape->setMargin(bsd->m_collisionMargin);
							//hullShape->initializePolyhedralFeatures();
							shape = hullShape;
							break;
						}
					default:
						{
							printf("error: cannot create shape type (%d)\n",shapeData->m_shapeType);
						}
				}

				if (shape)
				{
					shape->setMargin(bsd->m_collisionMargin);

					btVector3 localScaling;
					localScaling.deSerializeFloat(bsd->m_localScaling);
					shape->setLocalScaling(localScaling);

				}
				break;
			}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btTriangleMeshShapeData* trimesh = (btTriangleMeshShapeData*)shapeData;
			btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			btVector3 scaling; scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);


			btOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif


			btBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface,bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				btTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = btAdjustInternalEdgeContactsCallback;
#endif //USE_INTERNAL_EDGE_UTILITY

			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
			{
				btCompoundShapeData* compoundData = (btCompoundShapeData*)shapeData;
				btCompoundShape* compoundShape = createCompoundShape();

				btCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];


				btAlignedObjectArray<btCollisionShape*> childShapes;
				for (int i=0;i<compoundData->m_numChildShapes;i++)
				{
					btCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

					btCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

					btCollisionShape* childShape = convertCollisionShape(cd);
					if (childShape)
					{
						btTransform localTransform;
						localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
						compoundShape->addChildShape(localTransform,childShape);
					} else
					{
#ifdef _DEBUG
						printf("error: couldn't create childShape for compoundShape\n");
#endif
					}

				}
				shape = compoundShape;

				break;
			}
		case SOFTBODY_SHAPE_PROXYTYPE:
			{
				return 0;
			}
		default:
			{
#ifdef _DEBUG
				printf("unsupported shape type (%d)\n",shapeData->m_shapeType);
#endif
			}
		}

		return shape;

}